

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathModValues(xmlXPathParserContextPtr ctxt)

{
  xmlXPathObjectPtr pxVar1;
  double __y;
  double dVar2;
  int iStack_20;
  
  pxVar1 = xmlXPathValuePop(ctxt);
  if (pxVar1 == (xmlXPathObjectPtr)0x0) {
    iStack_20 = 10;
  }
  else {
    __y = xmlXPathCastToNumberInternal(ctxt,pxVar1);
    xmlXPathReleaseObject(ctxt->context,pxVar1);
    pxVar1 = ctxt->value;
    if (pxVar1 != (xmlXPathObjectPtr)0x0) {
      if (pxVar1->type == XPATH_NUMBER) {
LAB_001b272e:
        if ((__y != 0.0) || (dVar2 = xmlXPathNAN, NAN(__y))) {
          dVar2 = fmod(pxVar1->floatval,__y);
          pxVar1 = ctxt->value;
        }
        pxVar1->floatval = dVar2;
        return;
      }
      xmlXPathNumberFunction(ctxt,1);
      pxVar1 = ctxt->value;
      if ((pxVar1 != (xmlXPathObjectPtr)0x0) && (pxVar1->type == XPATH_NUMBER)) goto LAB_001b272e;
    }
    iStack_20 = 0xb;
  }
  xmlXPathErr(ctxt,iStack_20);
  return;
}

Assistant:

void
xmlXPathModValues(xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr arg;
    double arg1, arg2;

    arg = xmlXPathValuePop(ctxt);
    if (arg == NULL)
	XP_ERROR(XPATH_INVALID_OPERAND);
    arg2 = xmlXPathCastToNumberInternal(ctxt, arg);
    xmlXPathReleaseObject(ctxt->context, arg);
    CAST_TO_NUMBER;
    CHECK_TYPE(XPATH_NUMBER);
    arg1 = ctxt->value->floatval;
    if (arg2 == 0)
	ctxt->value->floatval = xmlXPathNAN;
    else {
	ctxt->value->floatval = fmod(arg1, arg2);
    }
}